

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Operator * __thiscall
parser::Parser::uniary(Operator *__return_storage_ptr__,Parser *this,TokenType t)

{
  string *this_00;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  if (t == BANG) {
    std::__cxx11::string::string((string *)&local_30,&(this->curToken).Literal);
    Operator::Operator(__return_storage_ptr__,BANG,&local_30);
    this_00 = &local_30;
  }
  else if (t == MINUS) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"-",&local_71);
    Operator::Operator(__return_storage_ptr__,UMINUS,&local_70);
    this_00 = &local_70;
  }
  else {
    std::__cxx11::string::string((string *)&local_50,&(this->curToken).Literal);
    Operator::Operator(__return_storage_ptr__,ERROR,&local_50);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Operator Parser::uniary(TokenType t)
{
    switch (t) {
    case TokenType::MINUS:
       return Operator(TokenType::UMINUS, "-");
    case TokenType::BANG:
        return Operator(TokenType::BANG, curToken.Literal);
    default:
        return Operator(TokenType::ERROR, curToken.Literal);
    }
}